

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_layout_row
               (nk_text_edit_row *r,nk_text_edit *edit,int line_start_id,float row_height,
               nk_user_font *font)

{
  int iVar1;
  char *pcVar2;
  nk_vec2 nVar3;
  float local_60;
  float fStack_5c;
  nk_vec2 size;
  char *text;
  char *end;
  int len;
  char *remaining;
  int local_30;
  nk_rune unicode;
  int glyphs;
  int l;
  nk_user_font *font_local;
  float row_height_local;
  int line_start_id_local;
  nk_text_edit *edit_local;
  nk_text_edit_row *r_local;
  
  local_30 = 0;
  _glyphs = font;
  font_local._0_4_ = row_height;
  font_local._4_4_ = line_start_id;
  _row_height_local = edit;
  edit_local = (nk_text_edit *)r;
  iVar1 = nk_str_len_char(&edit->string);
  pcVar2 = nk_str_get_const(&_row_height_local->string);
  text._0_4_ = (int)pcVar2 + iVar1;
  pcVar2 = nk_str_at_const(&_row_height_local->string,font_local._4_4_,
                           (nk_rune *)((long)&remaining + 4),(int *)&unicode);
  nVar3 = nk_text_calculate_text_bounds
                    (_glyphs,pcVar2,(int)text - (int)pcVar2,font_local._0_4_,
                     (char **)&stack0xffffffffffffffc0,(nk_vec2 *)0x0,&local_30,1);
  (edit_local->clip).userdata.id = 0;
  local_60 = nVar3.x;
  *(float *)((long)&(edit_local->clip).userdata + 4) = local_60;
  fStack_5c = nVar3.y;
  *(float *)&(edit_local->clip).paste = fStack_5c;
  *(undefined4 *)((long)&(edit_local->clip).paste + 4) = 0;
  *(float *)&(edit_local->clip).copy = fStack_5c;
  *(int *)((long)&(edit_local->clip).copy + 4) = local_30;
  return;
}

Assistant:

NK_INTERN void
nk_textedit_layout_row(struct nk_text_edit_row *r, struct nk_text_edit *edit,
    int line_start_id, float row_height, const struct nk_user_font *font)
{
    int l;
    int glyphs = 0;
    nk_rune unicode;
    const char *remaining;
    int len = nk_str_len_char(&edit->string);
    const char *end = nk_str_get_const(&edit->string) + len;
    const char *text = nk_str_at_const(&edit->string, line_start_id, &unicode, &l);
    const struct nk_vec2 size = nk_text_calculate_text_bounds(font,
        text, (int)(end - text), row_height, &remaining, 0, &glyphs, NK_STOP_ON_NEW_LINE);

    r->x0 = 0.0f;
    r->x1 = size.x;
    r->baseline_y_delta = size.y;
    r->ymin = 0.0f;
    r->ymax = size.y;
    r->num_chars = glyphs;
}